

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t y,uint32_t height,uint32_t value,double scale)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  int32_t pixel_00;
  uint local_64;
  uint local_54;
  uint32_t j;
  bool value_1;
  uint32_t i;
  uint32_t width;
  uint32_t pixel;
  uint32_t cursor;
  uint32_t scaleFactor;
  uint32_t barcodeLength;
  uint8_t barcode [9];
  double scale_local;
  uint32_t value_local;
  uint32_t height_local;
  uint32_t y_local;
  Bitmap *this_local;
  
  if (height != 0) {
    barcode._1_8_ = scale;
    uVar2 = BarcodeEan8::intToBarcode(value,(uint8_t *)((long)&scaleFactor + 3));
    if (this->orientation == Horizontally) {
      local_64 = this->width;
    }
    else {
      local_64 = this->height;
    }
    uVar3 = (uint)(long)(((double)barcode._1_8_ * (double)local_64) / (double)uVar2);
    width = local_64 - uVar3 * uVar2 >> 1;
    for (j = 0; j < uVar2; j = j + 1) {
      bVar1 = *(byte *)((long)&scaleFactor + (ulong)(j >> 3) + 3);
      for (local_54 = 0; local_54 < uVar3; local_54 = local_54 + 1) {
        pixel_00 = getPixelIndex(this,width,y);
        setPixelValue(this,pixel_00,((uint)bVar1 & 0x80 >> ((byte)j & 7)) != 0);
        width = width + 1;
      }
    }
    duplicateLineDown(this,y,height - 1);
  }
  return;
}

Assistant:

void Bitmap::drawBarcode(const uint32_t y, const uint32_t height, const uint32_t value, double scale)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t scaleFactor;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);

      //calculate a scale factor
      uint32_t width = ((orientation == Orientation::Horizontally) ? this->width : this->height);
      scaleFactor = (uint32_t)((scale * width) / barcodeLength);
      //calculate initial cursor position
      cursor = (width - (scaleFactor * barcodeLength)) / 2;

      //draw one barcode line
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < scaleFactor; ++j)
         {
            pixel = (uint32_t)getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}